

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_common.hpp
# Opt level: O0

void chaiscript::Name_Validator::validate_object_name<std::__cxx11::string>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *name)

{
  bool bVar1;
  reserved_word_error *this;
  size_type sVar2;
  illegal_name_error *this_00;
  string local_60;
  undefined1 local_3d;
  string local_30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *name_local;
  
  local_10 = name;
  bVar1 = is_reserved_word<std::__cxx11::string>(name);
  if (bVar1) {
    local_3d = 1;
    this = (reserved_word_error *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string((string *)&local_30,local_10);
    exception::reserved_word_error::reserved_word_error(this,&local_30);
    local_3d = 0;
    __cxa_throw(this,&exception::reserved_word_error::typeinfo,
                exception::reserved_word_error::~reserved_word_error);
  }
  sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                    (local_10,"::",0);
  if (sVar2 != 0xffffffffffffffff) {
    this_00 = (illegal_name_error *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string((string *)&local_60,local_10);
    exception::illegal_name_error::illegal_name_error(this_00,&local_60);
    __cxa_throw(this_00,&exception::illegal_name_error::typeinfo,
                exception::illegal_name_error::~illegal_name_error);
  }
  return;
}

Assistant:

static void validate_object_name(const T &name) {
      if (is_reserved_word(name)) {
        throw exception::reserved_word_error(std::string(name));
      }

      if (name.find("::") != std::string::npos) {
        throw exception::illegal_name_error(std::string(name));
      }
    }